

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O0

int32 limit_xm_getnc(char *ptr,int32 n,void *f)

{
  int iVar1;
  long *in_RDX;
  int in_ESI;
  void *in_RDI;
  int left;
  LIMITED_XM *lx;
  
  iVar1 = (int)in_RDX[3] - (int)in_RDX[1];
  if (iVar1 < in_ESI) {
    if (iVar1 < 1) {
      memset(in_RDI,0,(long)in_ESI);
    }
    else {
      memcpy(in_RDI,(void *)(*in_RDX + in_RDX[1]),(long)iVar1);
      memset((void *)((long)in_RDI + (long)iVar1),0,(long)(in_ESI - iVar1));
    }
  }
  else {
    memcpy(in_RDI,(void *)(*in_RDX + in_RDX[1]),(long)in_ESI);
  }
  in_RDX[1] = (long)in_ESI + in_RDX[1];
  return in_ESI;
}

Assistant:

static int32 DUMBCALLBACK limit_xm_getnc(char *ptr, int32 n, void *f)
{
	LIMITED_XM *lx = f;
	int left;
	left = lx->allocated - lx->ptr;
	if (n > left) {
		if (left > 0) {
			memcpy( ptr, lx->buffered + lx->ptr, left );
			memset( ptr + left, 0, n - left );
		} else {
			memset( ptr, 0, n );
		}
	} else {
		memcpy( ptr, lx->buffered + lx->ptr, n );
	}
	lx->ptr += n;
	return n;
}